

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

point3d * tinyusdz::vnormalize(point3d *__return_storage_ptr__,point3d *a,double eps)

{
  double dVar1;
  double __x;
  
  __x = a->z * a->z + a->x * a->x + a->y * a->y;
  dVar1 = 0.0;
  if (2.220446049250313e-16 < __x) {
    if (__x < 0.0) {
      dVar1 = sqrt(__x);
    }
    else {
      dVar1 = SQRT(__x);
    }
  }
  if (dVar1 <= eps) {
    dVar1 = eps;
  }
  __return_storage_ptr__->x = a->x / dVar1;
  __return_storage_ptr__->y = a->y / dVar1;
  __return_storage_ptr__->z = a->z / dVar1;
  return __return_storage_ptr__;
}

Assistant:

value::point3d vnormalize(const value::point3d &a, const double eps) {
  double len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::point3d({a[0] / len, a[1] / len, a[2] / len});
}